

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
          (QMovableArrayOps<QCss::Selector> *this,qsizetype i,Selector *args)

{
  qsizetype *pqVar1;
  Selector *pSVar2;
  Data *pDVar3;
  Data *pDVar4;
  long lVar5;
  Selector *pSVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QArrayDataPointer<QCss::BasicSelector> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    lVar5 = (this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.
            size;
    if ((lVar5 == i) &&
       (pSVar6 = (this->super_QGenericArrayOps<QCss::Selector>).
                 super_QArrayDataPointer<QCss::Selector>.ptr,
       (pDVar3->super_QArrayData).alloc - i !=
       ((long)((long)pSVar6 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       -0x5555555555555555)) {
      pDVar4 = (args->basicSelectors).d.d;
      pSVar6[i].basicSelectors.d.d = pDVar4;
      pSVar6[i].basicSelectors.d.ptr = (args->basicSelectors).d.ptr;
      pSVar6[i].basicSelectors.d.size = (args->basicSelectors).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
        i = (this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.
            size;
      }
      (this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.size =
           i + 1;
      goto LAB_005ed2ec;
    }
    if ((i == 0) &&
       (pSVar6 = (this->super_QGenericArrayOps<QCss::Selector>).
                 super_QArrayDataPointer<QCss::Selector>.ptr,
       (Selector *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) !=
       pSVar6)) {
      pDVar4 = (args->basicSelectors).d.d;
      pSVar6[-1].basicSelectors.d.d = pDVar4;
      pSVar6[-1].basicSelectors.d.ptr = (args->basicSelectors).d.ptr;
      pSVar6[-1].basicSelectors.d.size = (args->basicSelectors).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
        pSVar6 = (this->super_QGenericArrayOps<QCss::Selector>).
                 super_QArrayDataPointer<QCss::Selector>.ptr;
        lVar5 = (this->super_QGenericArrayOps<QCss::Selector>).
                super_QArrayDataPointer<QCss::Selector>.size;
      }
      (this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.ptr =
           pSVar6 + -1;
      (this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.size =
           lVar5 + 1;
      goto LAB_005ed2ec;
    }
  }
  local_40.d = (args->basicSelectors).d.d;
  local_40.ptr = (args->basicSelectors).d.ptr;
  local_40.size = (args->basicSelectors).d.size;
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar7 = (this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.
          size != 0;
  QArrayDataPointer<QCss::Selector>::detachAndGrow
            ((QArrayDataPointer<QCss::Selector> *)this,(uint)(i == 0 && bVar7),1,(Selector **)0x0,
             (QArrayDataPointer<QCss::Selector> *)0x0);
  pSVar6 = (this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.
           ptr;
  if (i == 0 && bVar7) {
    pSVar6[-1].basicSelectors.d.d = local_40.d;
    pSVar6[-1].basicSelectors.d.ptr = local_40.ptr;
    pSVar6[-1].basicSelectors.d.size = local_40.size;
    (this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.ptr =
         pSVar6 + -1;
  }
  else {
    pSVar2 = pSVar6 + i;
    memmove(pSVar2 + 1,pSVar6 + i,
            ((this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.
             size - i) * 0x18);
    (pSVar2->basicSelectors).d.d = local_40.d;
    (pSVar2->basicSelectors).d.ptr = local_40.ptr;
    (pSVar2->basicSelectors).d.size = local_40.size;
  }
  local_40.size = 0;
  local_40.ptr = (BasicSelector *)0x0;
  local_40.d = (Data *)0x0;
  pqVar1 = &(this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.
            size;
  *pqVar1 = *pqVar1 + 1;
  QArrayDataPointer<QCss::BasicSelector>::~QArrayDataPointer(&local_40);
LAB_005ed2ec:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }